

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O2

time_t curl_getdate(char *p,time_t *now)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  time_t tVar7;
  int i;
  uint uVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  long lVar12;
  char **what;
  char **ppcVar13;
  long lVar14;
  byte *pbVar15;
  byte *pbVar16;
  bool bVar17;
  int local_80;
  int local_7c;
  int local_78;
  uint local_74;
  int local_70;
  int len;
  int minnum;
  int hournum;
  int local_60;
  uint local_5c;
  char buf [32];
  
  hournum = -1;
  minnum = -1;
  local_78 = -1;
  local_80 = -1;
  local_74 = 0;
  local_5c = 0;
  uVar8 = 0xffffffff;
  lVar9 = 0xffffffff;
  pbVar15 = (byte *)p;
  local_7c = local_80;
  local_70 = local_80;
  while( true ) {
    bVar2 = *pbVar15;
    if ((bVar2 == 0) || (5 < local_5c)) break;
    lVar12 = 0;
    while (bVar2 != 0) {
      iVar3 = Curl_isalnum((uint)bVar2);
      if (iVar3 != 0) {
        uVar10 = (uint)pbVar15[lVar12];
        goto LAB_0012bd9e;
      }
      lVar14 = lVar12 + 1;
      lVar12 = lVar12 + 1;
      bVar2 = pbVar15[lVar14];
    }
    uVar10 = 0;
LAB_0012bd9e:
    iVar3 = Curl_isalpha(uVar10);
    pbVar16 = pbVar15 + lVar12;
    if (iVar3 == 0) {
      iVar3 = Curl_isdigit((uint)*pbVar16);
      if (iVar3 != 0) {
        len = 0;
        if (local_78 == -1) {
          iVar3 = __isoc99_sscanf(pbVar16,"%02d:%02d:%02d%n",&hournum,&minnum,&local_78,&len);
          if (iVar3 == 3) {
            pbVar16 = pbVar15 + len + lVar12;
          }
          else {
            if ((local_78 != -1) ||
               (iVar3 = __isoc99_sscanf(pbVar16,"%02d:%02d%n",&hournum,&minnum,&len), iVar3 != 2))
            goto LAB_0012be06;
            pbVar16 = pbVar15 + len + lVar12;
            local_78 = 0;
          }
        }
        else {
LAB_0012be06:
          piVar6 = __errno_location();
          local_60 = *piVar6;
          *piVar6 = 0;
          lVar14 = strtol((char *)pbVar16,(char **)buf,10);
          iVar3 = *piVar6;
          if (iVar3 != local_60) {
            *piVar6 = local_60;
          }
          if ((iVar3 != 0) || (lVar14 - 0x80000000U < 0xffffffff00000000)) goto LAB_0012c1c4;
          iVar3 = curlx_sltosi(lVar14);
          lVar14 = (buf._0_8_ - (long)pbVar15) - lVar12;
          if (local_80 == -1) {
            bVar1 = false;
            if ((p < pbVar16) && ((buf._0_8_ - (long)pbVar15) + -4 == lVar12)) {
              local_80 = -1;
              if (iVar3 < 0x579) {
                bVar2 = pbVar15[lVar12 + -1];
                if ((bVar2 != 0x2d) && (bVar2 != 0x2b)) {
                  lVar14 = 4;
                  goto LAB_0012c054;
                }
                iVar4 = (iVar3 / 100) * 0x3c + iVar3 % 100;
                local_80 = iVar4 * -0x3c;
                if (bVar2 != 0x2b) {
                  local_80 = iVar4 * 0x3c;
                }
                bVar1 = true;
                lVar14 = 4;
              }
            }
            else {
LAB_0012c054:
              bVar1 = false;
              local_80 = -1;
            }
          }
          else {
            bVar1 = false;
          }
          if ((((lVar14 == 8) && (local_7c == -1)) && (uVar8 == 0xffffffff)) && (local_70 == -1)) {
            local_7c = iVar3 / 10000;
            uVar8 = (uint)(short)((short)((long)iVar3 % 10000) / 100 + -1);
            local_70 = iVar3 % 100;
            bVar1 = true;
          }
          bVar11 = (bool)(local_70 == -1 & local_74 == 0 & ~bVar1);
          bVar17 = iVar3 - 1U < 0x1f;
          iVar4 = -1;
          if (bVar17) {
            iVar4 = iVar3;
          }
          bVar17 = (bool)(bVar17 & bVar11);
          if (bVar11) {
            local_74 = 1;
            local_70 = iVar4;
          }
          pbVar16 = (byte *)buf._0_8_;
          if (((bVar17 || bVar1) || (local_74 != 1)) || (local_7c != -1)) {
            if (!bVar17 && !bVar1) goto LAB_0012c1c4;
          }
          else {
            if (iVar3 < 100) {
              if (iVar3 < 0x47) {
                iVar3 = iVar3 + 2000;
              }
              else {
                iVar3 = iVar3 + 0x76c;
              }
            }
            local_74 = (uint)(local_70 != -1);
            local_7c = iVar3;
          }
        }
      }
    }
    else {
      buf[0x10] = '\0';
      buf[0x11] = '\0';
      buf[0x12] = '\0';
      buf[0x13] = '\0';
      buf[0x14] = '\0';
      buf[0x15] = '\0';
      buf[0x16] = '\0';
      buf[0x17] = '\0';
      buf[0x18] = '\0';
      buf[0x19] = '\0';
      buf[0x1a] = '\0';
      buf[0x1b] = '\0';
      buf[0x1c] = '\0';
      buf[0x1d] = '\0';
      buf[0x1e] = '\0';
      buf[0x1f] = '\0';
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      buf[4] = '\0';
      buf[5] = '\0';
      buf[6] = '\0';
      buf[7] = '\0';
      buf[8] = '\0';
      buf[9] = '\0';
      buf[10] = '\0';
      buf[0xb] = '\0';
      buf[0xc] = '\0';
      buf[0xd] = '\0';
      buf[0xe] = '\0';
      buf[0xf] = '\0';
      iVar3 = __isoc99_sscanf(pbVar16,"%31[ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz]",
                              buf);
      if (iVar3 == 0) {
        sVar5 = 0;
      }
      else {
        sVar5 = strlen(buf);
      }
      if ((int)lVar9 == -1) {
        ppcVar13 = Curl_wkday;
        if (3 < sVar5) {
          ppcVar13 = weekday;
        }
        for (lVar9 = 0; (int)lVar9 != 7; lVar9 = lVar9 + 1) {
          iVar3 = Curl_strcasecompare(buf,ppcVar13[lVar9]);
          if (iVar3 != 0) goto LAB_0012bf8e;
        }
        lVar9 = 0xffffffff;
      }
      if (uVar8 == 0xffffffff) {
        ppcVar13 = Curl_month;
        for (uVar8 = 0; uVar8 != 0xc; uVar8 = uVar8 + 1) {
          iVar3 = Curl_strcasecompare(buf,*ppcVar13);
          if (iVar3 != 0) goto LAB_0012bf8e;
          ppcVar13 = ppcVar13 + 1;
        }
        uVar8 = 0xffffffff;
      }
      if (local_80 != -1) goto LAB_0012c1c4;
      lVar14 = 0;
      while( true ) {
        if ((int)lVar14 == 0x33c) goto LAB_0012c1c4;
        iVar3 = Curl_strcasecompare(buf,tz[0].name + lVar14);
        if (iVar3 != 0) break;
        lVar14 = lVar14 + 0xc;
      }
      local_80 = *(int *)(tz[0].name + lVar14 + 8) * 0x3c;
LAB_0012bf8e:
      pbVar16 = pbVar15 + lVar12 + sVar5;
    }
    local_5c = local_5c + 1;
    pbVar15 = pbVar16;
  }
  if (local_78 == -1) {
    hournum = 0;
    minnum = 0;
    local_78 = 0;
  }
  if ((((local_70 == -1) || (uVar8 == 0xffffffff)) || (local_7c < 0x62f)) ||
     (((0x3c < local_78 || (0x1f < local_70)) ||
      ((0xb < (int)uVar8 || ((0x17 < hournum || (0x3b < minnum)))))))) {
LAB_0012c1c4:
    tVar7 = -1;
  }
  else {
    uVar10 = uVar8;
    if ((int)uVar8 < 0) {
      local_7c = local_7c + (0xb - uVar8) / 0xc;
      uVar10 = 0xb - (0xb - uVar8) % 0xc;
    }
    uVar8 = local_7c - (uint)((int)uVar8 < 2);
    if (local_80 == -1) {
      local_80 = 0;
    }
    lVar9 = (((long)hournum +
             ((long)local_70 + (long)(local_7c + -0x7b2) * 0x16d +
              (long)*(int *)(my_timegm_month_days_cumulative + (ulong)uVar10 * 4) +
             (long)(int)(uVar8 / 400 + ((uVar8 >> 2) - uVar8 / 100) + -0x1dd)) * 0x18) * 0x3c +
            (long)minnum) * 0x3c + (long)local_80 + (long)local_78 + -0x15180;
    tVar7 = 0;
    if (lVar9 != -1) {
      tVar7 = lVar9;
    }
  }
  return tVar7;
}

Assistant:

time_t curl_getdate(const char *p, const time_t *now)
{
  time_t parsed = -1;
  int rc = parsedate(p, &parsed);
  (void)now; /* legacy argument from the past that we ignore */

  if(rc == PARSEDATE_OK) {
    if(parsed == -1)
      /* avoid returning -1 for a working scenario */
      parsed++;
    return parsed;
  }
  /* everything else is fail */
  return -1;
}